

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O1

void Imf_3_4::Attribute::registerAttributeType(char *typeName,_func_Attribute_ptr *newAttribute)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  ArgExc *this;
  bool bVar7;
  key_type *__x;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  stringstream _iex_throw_s;
  char *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  __x = (key_type *)newAttribute;
  local_1c0 = typeName;
  anon_unknown_0::typeMap();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar4 = std::
          map<const_char_*,_Imf_3_4::Attribute_*(*)(),_Imf_3_4::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_4::Attribute_*(*)()>_>_>
          ::find((map<const_char_*,_Imf_3_4::Attribute_*(*)(),_Imf_3_4::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_4::Attribute_*(*)()>_>_>
                  *)&local_1c0,__x);
  p_Var9 = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header
  ;
  if ((_Rb_tree_header *)iVar4._M_node !=
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Cannot register image file attribute type \"",0x2b);
    poVar6 = std::operator<<(local_1a8,typeName);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\". The type has already been registered.",0x28);
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this,local_1b8);
    __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  p_Var8 = anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  if (anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent == (_Base_ptr)0x0) {
    bVar1 = 1;
  }
  else {
    do {
      p_Var9 = p_Var8;
      uVar3 = strcmp(typeName,*(char **)(p_Var9 + 1));
      p_Var8 = (&p_Var9->_M_left)[~uVar3 >> 0x1f];
    } while (p_Var8 != (_Base_ptr)0x0);
    bVar1 = (byte)(uVar3 >> 0x1f);
  }
  p_Var5 = p_Var9;
  if (bVar1 != 0) {
    if (p_Var9 == anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left) goto LAB_00157aee;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var9);
  }
  iVar2 = strcmp(*(char **)(p_Var5 + 1),typeName);
  if (-1 < iVar2) {
    p_Var8 = p_Var5;
    p_Var9 = (_Rb_tree_node_base *)0x0;
  }
LAB_00157aee:
  if (p_Var9 != (_Rb_tree_node_base *)0x0) {
    bVar7 = true;
    if ((p_Var8 == (_Base_ptr)0x0) &&
       ((_Rb_tree_header *)p_Var9 !=
        &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header)) {
      iVar2 = strcmp(typeName,*(char **)(p_Var9 + 1));
      bVar7 = SUB41((uint)iVar2 >> 0x1f,0);
    }
    p_Var5 = (_Rb_tree_node_base *)operator_new(0x30);
    *(char **)(p_Var5 + 1) = typeName;
    p_Var5[1]._M_parent = (_Base_ptr)newAttribute;
    std::_Rb_tree_insert_and_rebalance
              (bVar7,p_Var5,p_Var9,
               &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
                _M_header);
    anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
         anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
         _M_node_count + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
  return;
}

Assistant:

void
Attribute::registerAttributeType (
    const char typeName[], Attribute* (*newAttribute) ())
{
    LockedTypeMap& tMap = typeMap ();
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (tMap.mutex);
#endif
    if (tMap.find (typeName) != tMap.end ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot register image file attribute "
            "type \""
                << typeName
                << "\". "
                   "The type has already been registered.");

    tMap.insert (TypeMap::value_type (typeName, newAttribute));
}